

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  char **ppcVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  curl_strdup_callback p_Var9;
  char in_AL;
  int iVar10;
  FormInfo *pFVar11;
  int *piVar12;
  FormInfo *pFVar13;
  long *plVar14;
  curl_slist *pcVar15;
  undefined8 *puVar16;
  size_t sVar17;
  size_t sVar18;
  char *pcVar19;
  curl_httppost *pcVar20;
  curl_httppost *pcVar21;
  uint uVar22;
  undefined8 in_RCX;
  FormInfo *pFVar23;
  ulong uVar24;
  curl_httppost **ppcVar25;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar26;
  CURLFORMcode CVar27;
  FormInfo *ptr;
  curl_slist *pcVar28;
  FormInfo *ptr_1;
  int *piVar29;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  ulong local_158;
  char *local_150;
  size_t local_148;
  char *local_138;
  long local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  arg[0].overflow_arg_area = &stack0x00000008;
  uVar22 = 0x10;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pFVar11 = (FormInfo *)(*Curl_ccalloc)(1,0x80);
  if (pFVar11 == (FormInfo *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  pcVar28 = (curl_slist *)0x0;
  piVar29 = (int *)0x0;
  CVar27 = CURL_FORMADD_OK;
  pFVar23 = pFVar11;
  bVar7 = false;
switchD_004805f9_caseD_9:
  pFVar13 = pFVar11;
  if (CVar27 == CURL_FORMADD_OK) {
    if ((bool)(piVar29 != (int *)0x0 & bVar7)) goto code_r0x00480590;
    uVar24 = (ulong)uVar22;
    if (uVar24 < 0x29) {
      uVar22 = uVar22 + 8;
      piVar12 = (int *)((long)local_e8 + uVar24);
    }
    else {
      piVar12 = (int *)arg[0].overflow_arg_area;
      arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
    }
    iVar10 = *piVar12;
    if (iVar10 != 0x11) goto LAB_004805e5;
    CVar27 = CURL_FORMADD_OK;
    local_138 = (char *)0x0;
    pcVar21 = (curl_httppost *)0x0;
    pFVar23 = pFVar11;
    goto LAB_00480e0e;
  }
  for (; pFVar13 != (FormInfo *)0x0; pFVar13 = pFVar13->more) {
    if (pFVar13->name_alloc == true) {
      if (pFVar13->name != (char *)0x0) {
        (*Curl_cfree)(pFVar13->name);
        pFVar13->name = (char *)0x0;
      }
      pFVar13->name_alloc = false;
    }
    if (pFVar13->value_alloc == true) {
      if (pFVar13->value != (char *)0x0) {
        (*Curl_cfree)(pFVar13->value);
        pFVar13->value = (char *)0x0;
      }
      pFVar13->value_alloc = false;
    }
    if (pFVar13->contenttype_alloc == true) {
      if (pFVar13->contenttype != (char *)0x0) {
        (*Curl_cfree)(pFVar13->contenttype);
        pFVar13->contenttype = (char *)0x0;
      }
      pFVar13->contenttype_alloc = false;
    }
    if (pFVar13->showfilename_alloc == true) {
      if (pFVar13->showfilename != (char *)0x0) {
        (*Curl_cfree)(pFVar13->showfilename);
        pFVar13->showfilename = (char *)0x0;
      }
      pFVar13->showfilename_alloc = false;
    }
  }
  goto LAB_004811af;
code_r0x00480590:
  iVar10 = *piVar29;
  pcVar28 = *(curl_slist **)(piVar29 + 2);
  piVar29 = piVar29 + 4;
  CVar27 = CURL_FORMADD_OK;
  bVar7 = false;
  if (iVar10 == 0x11) goto switchD_004805f9_caseD_9;
  bVar7 = true;
LAB_004805e5:
  CVar27 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar15 = pcVar28;
  switch(iVar10) {
  case 2:
    *(byte *)&pFVar23->flags = (byte)pFVar23->flags | 4;
  case 1:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar23->name == (char *)0x0) {
      if (!bVar7) {
        uVar24 = (ulong)uVar22;
        if (uVar24 < 0x29) {
          uVar22 = uVar22 + 8;
          plVar14 = (long *)((long)local_e8 + uVar24);
        }
        else {
          plVar14 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar15 = (curl_slist *)*plVar14;
      }
      CVar27 = CURL_FORMADD_NULL;
      if (pcVar15 != (curl_slist *)0x0) {
        pFVar23->name = (char *)pcVar15;
        CVar27 = CURL_FORMADD_OK;
      }
    }
    goto switchD_004805f9_caseD_9;
  case 3:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar23->namelength == 0) {
      if (!bVar7) {
        uVar24 = (ulong)uVar22;
        if (uVar24 < 0x29) {
          uVar22 = uVar22 + 8;
          plVar14 = (long *)((long)local_e8 + uVar24);
        }
        else {
          plVar14 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar15 = (curl_slist *)*plVar14;
      }
      pFVar23->namelength = (size_t)pcVar15;
      CVar27 = CURL_FORMADD_OK;
    }
    goto switchD_004805f9_caseD_9;
  case 5:
    *(byte *)&pFVar23->flags = (byte)pFVar23->flags | 8;
  case 4:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar23->value != (char *)0x0) goto switchD_004805f9_caseD_9;
    if (!bVar7) {
      uVar24 = (ulong)uVar22;
      if (uVar24 < 0x29) {
        uVar22 = uVar22 + 8;
        plVar14 = (long *)((long)local_e8 + uVar24);
      }
      else {
        plVar14 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar15 = (curl_slist *)*plVar14;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar15 == (curl_slist *)0x0) goto switchD_004805f9_caseD_9;
    break;
  case 6:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar23->contentslength == 0) {
      if (!bVar7) {
        uVar24 = (ulong)uVar22;
        if (uVar24 < 0x29) {
          uVar22 = uVar22 + 8;
          plVar14 = (long *)((long)local_e8 + uVar24);
        }
        else {
          plVar14 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar15 = (curl_slist *)*plVar14;
      }
      pFVar23->contentslength = (size_t)pcVar15;
      CVar27 = CURL_FORMADD_OK;
    }
    goto switchD_004805f9_caseD_9;
  case 7:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if ((pFVar23->flags & 10) != 0) goto switchD_004805f9_caseD_9;
    if (!bVar7) {
      uVar24 = (ulong)uVar22;
      if (uVar24 < 0x29) {
        uVar22 = uVar22 + 8;
        puVar16 = (undefined8 *)((long)local_e8 + uVar24);
      }
      else {
        puVar16 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar15 = (curl_slist *)*puVar16;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar15 == (curl_slist *)0x0) goto switchD_004805f9_caseD_9;
    pcVar19 = (*Curl_cstrdup)((char *)pcVar15);
    pFVar23->value = pcVar19;
    CVar27 = CURL_FORMADD_MEMORY;
    if (pcVar19 == (char *)0x0) goto switchD_004805f9_caseD_9;
    *(byte *)&pFVar23->flags = (byte)pFVar23->flags | 2;
    goto LAB_00480d28;
  case 8:
    CVar27 = CURL_FORMADD_ILLEGAL_ARRAY;
    bVar8 = !bVar7;
    bVar7 = true;
    if (bVar8) {
      uVar24 = (ulong)uVar22;
      if (uVar24 < 0x29) {
        uVar22 = uVar22 + 8;
        puVar16 = (undefined8 *)((long)local_e8 + uVar24);
      }
      else {
        puVar16 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      piVar29 = (int *)*puVar16;
      bVar7 = piVar29 != (int *)0x0;
      CVar27 = (uint)(piVar29 == (int *)0x0) * 3;
    }
  default:
    goto switchD_004805f9_caseD_9;
  case 10:
    if (!bVar7) {
      uVar24 = (ulong)uVar22;
      if (uVar24 < 0x29) {
        uVar22 = uVar22 + 8;
        puVar16 = (undefined8 *)((long)local_e8 + uVar24);
      }
      else {
        puVar16 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar15 = (curl_slist *)*puVar16;
    }
    if (pFVar23->value != (char *)0x0) {
      CVar27 = CURL_FORMADD_OPTION_TWICE;
      if (((pFVar23->flags & 1) == 0) || (CVar27 = CURL_FORMADD_NULL, pcVar15 == (curl_slist *)0x0))
      goto switchD_004805f9_caseD_9;
      pcVar19 = (*Curl_cstrdup)((char *)pcVar15);
      CVar27 = CURL_FORMADD_MEMORY;
      if (pcVar19 == (char *)0x0) goto switchD_004805f9_caseD_9;
      pFVar13 = AddFormInfo(pcVar19,(char *)0x0,pFVar23);
      if (pFVar13 == (FormInfo *)0x0) goto LAB_00480d34;
      pFVar13->value_alloc = true;
      goto LAB_00480ad5;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar15 == (curl_slist *)0x0) goto switchD_004805f9_caseD_9;
    pcVar19 = (*Curl_cstrdup)((char *)pcVar15);
    pFVar23->value = pcVar19;
    CVar27 = CURL_FORMADD_MEMORY;
    if (pcVar19 == (char *)0x0) goto switchD_004805f9_caseD_9;
    *(byte *)&pFVar23->flags = (byte)pFVar23->flags | 1;
LAB_00480d28:
    pFVar23->value_alloc = true;
    CVar27 = CURL_FORMADD_OK;
    goto switchD_004805f9_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar7) {
      uVar24 = (ulong)uVar22;
      if (uVar24 < 0x29) {
        uVar22 = uVar22 + 8;
        puVar16 = (undefined8 *)((long)local_e8 + uVar24);
      }
      else {
        puVar16 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar15 = (curl_slist *)*puVar16;
    }
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar23->showfilename == (char *)0x0) {
      pcVar19 = (*Curl_cstrdup)((char *)pcVar15);
      pFVar23->showfilename = pcVar19;
      CVar27 = CURL_FORMADD_MEMORY;
      if (pcVar19 != (char *)0x0) {
        pFVar23->showfilename_alloc = true;
        CVar27 = CURL_FORMADD_OK;
      }
    }
    goto switchD_004805f9_caseD_9;
  case 0xc:
    *(byte *)&pFVar23->flags = (byte)pFVar23->flags | 0x30;
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar23->buffer != (char *)0x0) goto switchD_004805f9_caseD_9;
    if (!bVar7) {
      uVar24 = (ulong)uVar22;
      if (uVar24 < 0x29) {
        uVar22 = uVar22 + 8;
        plVar14 = (long *)((long)local_e8 + uVar24);
      }
      else {
        plVar14 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar15 = (curl_slist *)*plVar14;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar15 == (curl_slist *)0x0) goto switchD_004805f9_caseD_9;
    pFVar23->buffer = (char *)pcVar15;
    break;
  case 0xd:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar23->bufferlength == 0) {
      if (!bVar7) {
        uVar24 = (ulong)uVar22;
        if (uVar24 < 0x29) {
          uVar22 = uVar22 + 8;
          plVar14 = (long *)((long)local_e8 + uVar24);
        }
        else {
          plVar14 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar15 = (curl_slist *)*plVar14;
      }
      pFVar23->bufferlength = (size_t)pcVar15;
      CVar27 = CURL_FORMADD_OK;
    }
    goto switchD_004805f9_caseD_9;
  case 0xe:
    if (!bVar7) {
      uVar24 = (ulong)uVar22;
      if (uVar24 < 0x29) {
        uVar22 = uVar22 + 8;
        puVar16 = (undefined8 *)((long)local_e8 + uVar24);
      }
      else {
        puVar16 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar15 = (curl_slist *)*puVar16;
    }
    if (pFVar23->contenttype == (char *)0x0) {
      CVar27 = CURL_FORMADD_NULL;
      if (pcVar15 != (curl_slist *)0x0) {
        pcVar19 = (*Curl_cstrdup)((char *)pcVar15);
        pFVar23->contenttype = pcVar19;
        CVar27 = CURL_FORMADD_MEMORY;
        if (pcVar19 != (char *)0x0) {
          pFVar23->contenttype_alloc = true;
          CVar27 = CURL_FORMADD_OK;
        }
      }
      goto switchD_004805f9_caseD_9;
    }
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (((pFVar23->flags & 1) == 0) || (CVar27 = CURL_FORMADD_NULL, pcVar15 == (curl_slist *)0x0))
    goto switchD_004805f9_caseD_9;
    pcVar19 = (*Curl_cstrdup)((char *)pcVar15);
    CVar27 = CURL_FORMADD_MEMORY;
    if (pcVar19 == (char *)0x0) goto switchD_004805f9_caseD_9;
    pFVar13 = AddFormInfo((char *)0x0,pcVar19,pFVar23);
    if (pFVar13 == (FormInfo *)0x0) {
LAB_00480d34:
      (*Curl_cfree)(pcVar19);
      CVar27 = CURL_FORMADD_MEMORY;
      goto switchD_004805f9_caseD_9;
    }
    pFVar13->contenttype_alloc = true;
LAB_00480ad5:
    CVar27 = CURL_FORMADD_OK;
    pFVar23 = pFVar13;
    goto switchD_004805f9_caseD_9;
  case 0xf:
    if (!bVar7) {
      uVar24 = (ulong)uVar22;
      if (uVar24 < 0x29) {
        uVar22 = uVar22 + 8;
        plVar14 = (long *)((long)local_e8 + uVar24);
      }
      else {
        plVar14 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar15 = (curl_slist *)*plVar14;
    }
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar23->contentheader == (curl_slist *)0x0) {
      pFVar23->contentheader = pcVar15;
      CVar27 = CURL_FORMADD_OK;
    }
    goto switchD_004805f9_caseD_9;
  case 0x13:
    *(byte *)&pFVar23->flags = (byte)pFVar23->flags | 0x40;
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar23->userp != (char *)0x0) goto switchD_004805f9_caseD_9;
    if (!bVar7) {
      uVar24 = (ulong)uVar22;
      if (uVar24 < 0x29) {
        uVar22 = uVar22 + 8;
        plVar14 = (long *)((long)local_e8 + uVar24);
      }
      else {
        plVar14 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar15 = (curl_slist *)*plVar14;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar15 == (curl_slist *)0x0) goto switchD_004805f9_caseD_9;
    pFVar23->userp = (char *)pcVar15;
  }
  pFVar23->value = (char *)pcVar15;
  CVar27 = CURL_FORMADD_OK;
  goto switchD_004805f9_caseD_9;
LAB_00480e0e:
  p_Var9 = Curl_cstrdup;
  if (pFVar23 != (FormInfo *)0x0) {
    if (pFVar23->name == (char *)0x0) {
      if (pcVar21 == (curl_httppost *)0x0) goto LAB_00481113;
LAB_00480e34:
      local_158 = pFVar23->flags;
      if (((((pFVar23->contentslength != 0 & (byte)local_158) != 0) ||
           (uVar22 = (uint)local_158, (uVar22 & 9) == 9)) || ((~uVar22 & 10) == 0)) ||
         ((~uVar22 & 0x30) == 0 && pFVar23->buffer == (char *)0x0)) goto LAB_00481113;
      if (((local_158 & 0x11) != 0) && (pFVar23->contenttype == (char *)0x0)) {
        pcVar19 = *(char **)((long)&pFVar23->value + (ulong)(uVar22 & 0x10) * 4);
        local_150 = local_138;
        if (local_138 == (char *)0x0) {
          local_150 = "application/octet-stream";
        }
        if (pcVar19 != (char *)0x0) {
          for (lVar26 = 8; lVar26 != 0x68; lVar26 = lVar26 + 0x10) {
            sVar17 = strlen(pcVar19);
            pcVar2 = *(char **)(&UNK_005c79f8 + lVar26);
            sVar18 = strlen(pcVar2);
            if ((sVar18 <= sVar17) &&
               (iVar10 = curl_strequal(pcVar19 + (sVar17 - sVar18),pcVar2), iVar10 != 0)) {
              local_150 = *(char **)((long)&ContentTypeForFilename_ctts + lVar26);
              break;
            }
          }
        }
        pcVar19 = (*p_Var9)(local_150);
        pFVar23->contenttype = pcVar19;
        if (pcVar19 != (char *)0x0) {
          pFVar23->contenttype_alloc = true;
          local_158 = pFVar23->flags;
          goto LAB_00480f48;
        }
LAB_00481118:
        CVar27 = CURL_FORMADD_MEMORY;
        goto LAB_00481197;
      }
LAB_00480f48:
      if (pFVar23 == pFVar11 && (local_158 & 4) == 0) {
        if (pFVar23->name != (char *)0x0) {
          pcVar19 = memdup(pFVar23->name,pFVar23->namelength);
          pFVar23->name = pcVar19;
          if (pcVar19 != (char *)0x0) {
            pFVar23->name_alloc = true;
            local_158 = pFVar23->flags;
            goto LAB_00480f83;
          }
        }
        goto LAB_00481118;
      }
LAB_00480f83:
      local_150 = pFVar23->value;
      local_148 = pFVar23->contentslength;
      if ((local_158 & 0x6b) == 0) {
        local_150 = memdup(local_150,local_148);
        pFVar23->value = local_150;
        if (local_150 == (char *)0x0) goto LAB_00481118;
        pFVar23->value_alloc = true;
        local_148 = pFVar23->contentslength;
        local_158 = pFVar23->flags;
      }
      pcVar19 = pFVar23->name;
      sVar17 = pFVar23->namelength;
      pcVar2 = pFVar23->buffer;
      sVar3 = pFVar23->bufferlength;
      pcVar4 = pFVar23->contenttype;
      pcVar28 = pFVar23->contentheader;
      pcVar5 = pFVar23->showfilename;
      pcVar6 = pFVar23->userp;
      pcVar20 = (curl_httppost *)(*Curl_ccalloc)(1,0x68);
      if (pcVar20 == (curl_httppost *)0x0) goto LAB_00481118;
      pcVar20->name = pcVar19;
      if (pcVar19 == (char *)0x0) {
        sVar17 = 0;
      }
      else if (sVar17 == 0) {
        sVar17 = strlen(pcVar19);
      }
      pcVar20->namelength = sVar17;
      pcVar20->contents = local_150;
      pcVar20->contentslength = local_148;
      pcVar20->buffer = pcVar2;
      pcVar20->bufferlength = sVar3;
      pcVar20->contenttype = pcVar4;
      pcVar20->contentheader = pcVar28;
      pcVar20->showfilename = pcVar5;
      pcVar20->userp = pcVar6;
      pcVar20->flags = local_158;
      if (pcVar21 == (curl_httppost *)0x0) {
        pcVar21 = *last_post;
        if (*last_post == (curl_httppost *)0x0) {
          pcVar21 = (curl_httppost *)httppost;
        }
        pcVar21->next = pcVar20;
        ppcVar25 = last_post;
      }
      else {
        pcVar20->more = pcVar21->more;
        ppcVar25 = &pcVar21->more;
      }
      *ppcVar25 = pcVar20;
      ppcVar1 = &pFVar23->contenttype;
      pFVar23 = pFVar23->more;
      pcVar21 = pcVar20;
      if (*ppcVar1 != (char *)0x0) {
        local_138 = *ppcVar1;
      }
      goto LAB_00480e0e;
    }
    if (pFVar23->value != (char *)0x0 || pcVar21 != (curl_httppost *)0x0) goto LAB_00480e34;
LAB_00481113:
    CVar27 = CURL_FORMADD_INCOMPLETE;
LAB_00481197:
    for (; pFVar23 != (FormInfo *)0x0; pFVar23 = pFVar23->more) {
      if (pFVar23->name_alloc == true) {
        if (pFVar23->name != (char *)0x0) {
          (*Curl_cfree)(pFVar23->name);
          pFVar23->name = (char *)0x0;
        }
        pFVar23->name_alloc = false;
      }
      if (pFVar23->value_alloc == true) {
        if (pFVar23->value != (char *)0x0) {
          (*Curl_cfree)(pFVar23->value);
          pFVar23->value = (char *)0x0;
        }
        pFVar23->value_alloc = false;
      }
      if (pFVar23->contenttype_alloc == true) {
        if (pFVar23->contenttype != (char *)0x0) {
          (*Curl_cfree)(pFVar23->contenttype);
          pFVar23->contenttype = (char *)0x0;
        }
        pFVar23->contenttype_alloc = false;
      }
      if (pFVar23->showfilename_alloc == true) {
        if (pFVar23->showfilename != (char *)0x0) {
          (*Curl_cfree)(pFVar23->showfilename);
          pFVar23->showfilename = (char *)0x0;
        }
        pFVar23->showfilename_alloc = false;
      }
    }
  }
LAB_004811af:
  while (pFVar11 != (FormInfo *)0x0) {
    pFVar23 = pFVar11->more;
    (*Curl_cfree)(pFVar11);
    pFVar11 = pFVar23;
  }
  return CVar27;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}